

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O1

void ZXing::QRCode::EmbedPositionDetectionPattern(int xStart,int yStart,TritMatrix *matrix)

{
  int iVar1;
  long lVar2;
  value_t vVar3;
  uint uVar4;
  long lVar5;
  pointer pTVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  undefined4 uVar10;
  long lVar11;
  pointer pTVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar20;
  uint uVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  iVar1 = matrix->_width;
  lVar2 = (long)xStart;
  pTVar6 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start + (long)iVar1 * (long)yStart + lVar2 + 6;
  lVar7 = 0;
  do {
    uVar9 = (int)lVar7 - 3;
    uVar4 = -uVar9;
    if (0 < (int)uVar9) {
      uVar4 = uVar9;
    }
    uVar13 = -(uint)(-0x7fffffff < (int)(uVar4 ^ 0x80000000));
    uVar14 = -(uint)(-0x7ffffffe < (int)(uVar4 ^ 0x80000000));
    uVar15 = -(uint)(-0x7ffffffd < (int)(uVar4 ^ 0x80000000));
    uVar13 = ~uVar13 & 1 | uVar4 & uVar13;
    uVar14 = ~uVar14 & 2 | uVar4 & uVar14;
    uVar16 = -(uint)(-0x7ffffffd < (int)(uVar4 ^ 0x80000000));
    uVar20 = -(uint)(-0x7ffffffe < (int)(uVar4 ^ 0x80000000));
    uVar21 = -(uint)(-0x7fffffff < (int)(uVar4 ^ 0x80000000));
    auVar17._0_4_ = -(uint)((~uVar16 & 3 | uVar4 & uVar16) == 2);
    auVar17._4_4_ = -(uint)((~uVar20 & 2 | uVar4 & uVar20) == 2);
    auVar17._8_4_ = -(uint)((~uVar21 & 1 | uVar4 & uVar21) == 2);
    auVar17._12_4_ = -(uint)((uVar4 & -(uint)(-0x80000000 < (int)(uVar4 ^ 0x80000000))) == 2);
    auVar18 = packssdw(auVar17,auVar17);
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    auVar19._12_4_ = 0xffffffff;
    auVar19 = packsswb(auVar18 ^ auVar19,auVar18 ^ auVar19);
    *(uint *)(pTVar6 + -6) = auVar19._0_4_ & 0x1010101;
    auVar18._0_4_ = -(uint)(uVar13 == 2);
    auVar18._4_4_ = -(uint)(uVar13 == 2);
    auVar18._8_4_ = -(uint)(uVar14 == 2);
    auVar18._12_4_ = -(uint)(uVar14 == 2);
    uVar10 = movmskpd(uVar9,auVar18);
    vVar3 = (value_t)uVar10 ^ (empty_v|true_v);
    pTVar6[-2].value = vVar3 & true_v;
    pTVar6[-1].value = vVar3 >> 1;
    pTVar6->value = (~uVar15 & 3 | uVar4 & uVar15) != 2;
    lVar7 = lVar7 + 1;
    pTVar6 = pTVar6 + iVar1;
  } while (lVar7 != 7);
  iVar1 = matrix->_width;
  lVar8 = (long)iVar1;
  pTVar6 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar7 = (long)yStart + -1;
  pTVar12 = pTVar6 + lVar7 * lVar8;
  lVar11 = 0;
  do {
    lVar5 = lVar2 + -1 + lVar11;
    if (-1 < lVar5) {
      if (((0 < yStart) && (lVar5 < lVar8)) && (yStart <= matrix->_height)) {
        pTVar6[lVar11 + (yStart + -1) * iVar1 + lVar2 + -1].value = false_v;
      }
      if (((-1 < lVar5) && (-8 < yStart)) && ((lVar5 < lVar8 && (yStart + 7 < matrix->_height)))) {
        pTVar6[lVar11 + iVar1 * (yStart + 7) + lVar2 + -1].value = false_v;
      }
    }
    lVar5 = lVar7 + lVar11;
    if (((0 < xStart) && (-1 < lVar5)) && ((xStart <= iVar1 && (lVar5 < matrix->_height)))) {
      pTVar12[(ulong)(uint)xStart - 1].value = false_v;
    }
    if ((((-8 < xStart) && (-1 < lVar5)) && (xStart + 7 < iVar1)) && (lVar5 < matrix->_height)) {
      pTVar12[xStart + 7].value = false_v;
    }
    lVar11 = lVar11 + 1;
    pTVar12 = pTVar12 + lVar8;
  } while (lVar11 != 9);
  return;
}

Assistant:

static void EmbedPositionDetectionPattern(int xStart, int yStart, TritMatrix& matrix)
{
	for (int y = 0; y < 7; ++y)
		for (int x = 0; x < 7; ++x)
			matrix.set(xStart + x, yStart + y, maxAbsComponent(PointI(x, y) - PointI(3, 3)) != 2);

	// Surround the 7x7 pattern with one line of white space (separation pattern)
	auto setIfInside = [&](int x, int y) {
		if( x >= 0 && x < matrix.width() && y >= 0 && y < matrix.height())
			matrix.set(x, y, 0);
	};

	for (int i = -1; i < 8; ++i) {
		setIfInside(xStart + i, yStart - 1); // top
		setIfInside(xStart + i, yStart + 7); // bottom
		setIfInside(xStart - 1, yStart + i); // left
		setIfInside(xStart + 7, yStart + i); // right
	}
}